

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_log_helper.h
# Opt level: O1

void __thiscall
spdlog::details::async_log_helper::push_msg(async_log_helper *this,async_msg *new_msg)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  timespec local_30;
  
  bVar1 = mpmc_bounded_queue<spdlog::details::async_log_helper::async_msg>::enqueue
                    (&this->_q,new_msg);
  if ((!bVar1) && (this->_overflow_policy != discard_log_msg)) {
    lVar3 = std::chrono::_V2::system_clock::now();
    do {
      lVar4 = std::chrono::_V2::system_clock::now();
      lVar4 = lVar4 - lVar3;
      if (50000 < lVar4) {
        if (lVar4 < 0x186a1) {
          sched_yield();
        }
        else if (lVar4 < 0xbebc201) {
          local_30.tv_sec = 0;
          local_30.tv_nsec = 20000000;
          do {
            iVar2 = nanosleep(&local_30,&local_30);
            if (iVar2 != -1) break;
            piVar5 = __errno_location();
          } while (*piVar5 == 4);
        }
        else {
          local_30.tv_sec = 0;
          local_30.tv_nsec = 500000000;
          do {
            iVar2 = nanosleep(&local_30,&local_30);
            if (iVar2 != -1) break;
            piVar5 = __errno_location();
          } while (*piVar5 == 4);
        }
      }
      bVar1 = mpmc_bounded_queue<spdlog::details::async_log_helper::async_msg>::enqueue
                        (&this->_q,new_msg);
    } while (!bVar1);
  }
  return;
}

Assistant:

inline void spdlog::details::async_log_helper::push_msg(details::async_log_helper::async_msg &&new_msg)
{
    if (!_q.enqueue(std::move(new_msg)) && _overflow_policy != async_overflow_policy::discard_log_msg)
    {
        auto last_op_time = details::os::now();
        auto now = last_op_time;
        do
        {
            now = details::os::now();
            sleep_or_yield(now, last_op_time);
        } while (!_q.enqueue(std::move(new_msg)));
    }
}